

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

bool ModActorFlag(AActor *actor,FString *flagname,bool set,bool printerror)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  FFlagDef *pFVar3;
  long lVar4;
  uint uVar5;
  FString part1;
  FLinkContext local_48;
  PClassActor *info;
  
  if (actor == (AActor *)0x0) {
    return false;
  }
  pcVar2 = strchr(flagname->Chars,0x2e);
  info = (PClassActor *)(actor->super_DThinker).super_DObject.Class;
  if (info == (PClassActor *)0x0) {
    iVar1 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    info = (PClassActor *)CONCAT44(extraout_var,iVar1);
    (actor->super_DThinker).super_DObject.Class = (PClass *)info;
  }
  if (pcVar2 == (char *)0x0) {
    pFVar3 = FindFlag(&info->super_PClass,flagname->Chars,(char *)0x0,false);
  }
  else {
    FString::FString((FString *)&local_48,flagname->Chars,(long)pcVar2 - (long)flagname->Chars);
    pFVar3 = FindFlag(&info->super_PClass,(char *)local_48.sector_list,pcVar2 + 1,false);
    FString::~FString((FString *)&local_48);
  }
  if (pFVar3 == (FFlagDef *)0x0) {
    if (!printerror) {
      return false;
    }
    DPrintf(1,"ACS/DECORATE: \'%s\' is not a flag in \'%s\'\n",flagname->Chars,
            FName::NameData.NameArray
            [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index]
            .Text);
    return false;
  }
  uVar5 = (actor->flags).Value;
  if (((uVar5 & 0x8400000) == 0x400000) && (0 < actor->health)) {
    level.total_monsters = level.total_monsters + -1;
  }
  if ((uVar5 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + -1;
  }
  if (((actor->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + -1;
  }
  lVar4 = (long)pFVar3->structoffset;
  if (lVar4 == 0x1bc) {
    uVar5 = pFVar3->flagbit;
    local_48.sector_list = (msecnode_t *)0x0;
    local_48.render_list = (msecnode_t *)0x0;
    if ((uVar5 == 0x10) || (uVar5 == 8)) {
      AActor::UnlinkFromWorld(actor,&local_48);
      lVar4 = (long)pFVar3->structoffset;
      if (set) {
        uVar5 = pFVar3->flagbit |
                *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4);
      }
      else {
        uVar5 = ~pFVar3->flagbit &
                *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4);
      }
      *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4) = uVar5;
      AActor::LinkToWorld(actor,&local_48,false,(sector_t *)0x0);
      goto LAB_0051a12a;
    }
  }
  else {
    if (pFVar3->structoffset == -1) {
      HandleDeprecatedFlags(actor,info,set,pFVar3->flagbit);
      goto LAB_0051a12a;
    }
    uVar5 = pFVar3->flagbit;
  }
  if (set) {
    uVar5 = uVar5 | *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4);
  }
  else {
    uVar5 = ~uVar5 & *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4);
  }
  *(uint *)((long)&(actor->super_DThinker).super_DObject._vptr_DObject + lVar4) = uVar5;
LAB_0051a12a:
  uVar5 = (actor->flags).Value;
  if (((uVar5 & 0x8400000) == 0x400000) && (0 < actor->health)) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar5 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if (((actor->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
    return true;
  }
  return true;
}

Assistant:

bool ModActorFlag(AActor *actor, FString &flagname, bool set, bool printerror)
{
	bool found = false;

	if (actor != NULL)
	{
		const char *dot = strchr(flagname, '.');
		FFlagDef *fd;
		PClassActor *cls = actor->GetClass();

		if (dot != NULL)
		{
			FString part1(flagname.GetChars(), dot - flagname);
			fd = FindFlag(cls, part1, dot + 1);
		}
		else
		{
			fd = FindFlag(cls, flagname, NULL);
		}

		if (fd != NULL)
		{
			found = true;

			if (actor->CountsAsKill() && actor->health > 0) --level.total_monsters;
			if (actor->flags & MF_COUNTITEM) --level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) --level.total_secrets;

			if (fd->structoffset == -1)
			{
				HandleDeprecatedFlags(actor, cls, set, fd->flagbit);
			}
			else
			{
				ActorFlags *flagp = (ActorFlags*)(((char*)actor) + fd->structoffset);

				// If these 2 flags get changed we need to update the blockmap and sector links.
				bool linkchange = flagp == &actor->flags && (fd->flagbit == MF_NOBLOCKMAP || fd->flagbit == MF_NOSECTOR);

				FLinkContext ctx;
				if (linkchange) actor->UnlinkFromWorld(&ctx);
				ModActorFlag(actor, fd, set);
				if (linkchange) actor->LinkToWorld(&ctx);
			}

			if (actor->CountsAsKill() && actor->health > 0) ++level.total_monsters;
			if (actor->flags & MF_COUNTITEM) ++level.total_items;
			if (actor->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
		}
		else if (printerror)
		{
			DPrintf(DMSG_ERROR, "ACS/DECORATE: '%s' is not a flag in '%s'\n", flagname.GetChars(), cls->TypeName.GetChars());
		}
	}

	return found;
}